

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

int FindAndDelete(CScript *script,CScript *b)

{
  uchar *puVar1;
  uchar *puVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  CScript *pCVar7;
  const_iterator first;
  undefined8 uVar8;
  long lVar9;
  int iVar10;
  const_iterator last;
  int iVar11;
  long in_FS_OFFSET;
  opcodetype opcode;
  const_iterator pc;
  CScript result;
  opcodetype local_64;
  const_iterator local_60;
  direct_or_indirect local_58;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (b->super_CScriptBase)._size;
  uVar5 = uVar6 - 0x1d;
  if (uVar6 < 0x1d) {
    uVar5 = uVar6;
  }
  if (uVar5 == 0) {
    iVar11 = 0;
  }
  else {
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    local_58._24_4_ = 0;
    uStack_3c = 0;
    local_58.indirect_contents.indirect = (char *)0x0;
    local_58.indirect_contents.capacity = 0;
    local_58._12_4_ = 0;
    uVar6 = (script->super_CScriptBase)._size;
    uVar5 = uVar6 - 0x1d;
    first.ptr = (uchar *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar6 < 0x1d) {
      uVar5 = uVar6;
      first.ptr = (uchar *)script;
    }
    last.ptr = (uchar *)((long)&(((CScript *)first.ptr)->super_CScriptBase)._union +
                        (long)(int)uVar5);
    iVar11 = 0;
    local_60.ptr = first.ptr;
    do {
      uVar6 = uStack_3c - 0x1d;
      if (uStack_3c < 0x1d) {
        uVar6 = uStack_3c;
      }
      uVar8 = local_58.indirect_contents.indirect;
      if (uStack_3c < 0x1d) {
        uVar8 = &local_58;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
                 (uchar *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar8)->
                                  indirect + (long)(int)uVar6),first,local_60);
      uVar6 = (b->super_CScriptBase)._size;
      uVar5 = uVar6 - 0x1d;
      if (uVar6 < 0x1d) {
        uVar5 = uVar6;
      }
      uVar4 = (ulong)uVar5;
      iVar10 = (int)last.ptr;
      if (uVar4 <= (ulong)(long)(iVar10 - (int)local_60.ptr)) {
        pCVar7 = b;
        if (0x1c < uVar6) {
          pCVar7 = (CScript *)(b->super_CScriptBase)._union.indirect_contents.indirect;
        }
        do {
          bVar3 = uVar4 == 0;
          if (uVar5 != 0) {
            if ((pCVar7->super_CScriptBase)._union.direct[0] != *local_60.ptr) break;
            lVar9 = 1;
            while (bVar3 = (int)uVar5 == lVar9, !bVar3) {
              puVar1 = (uchar *)((pCVar7->super_CScriptBase)._union.direct + lVar9);
              puVar2 = local_60.ptr + lVar9;
              lVar9 = lVar9 + 1;
              if (*puVar1 != *puVar2) goto LAB_001ec772;
            }
          }
          if (!bVar3) break;
          local_60.ptr = local_60.ptr + uVar4;
          iVar11 = iVar11 + 1;
        } while (uVar4 <= (ulong)(long)(iVar10 - (int)local_60.ptr));
      }
LAB_001ec772:
      first.ptr = local_60.ptr;
      uVar6 = (script->super_CScriptBase)._size;
      uVar5 = uVar6 - 0x1d;
      if (uVar6 < 0x1d) {
        uVar5 = uVar6;
      }
      pCVar7 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar6 < 0x1d) {
        pCVar7 = script;
      }
      bVar3 = GetScriptOp(&local_60,
                          (uchar *)((long)&(pCVar7->super_CScriptBase)._union + (long)(int)uVar5),
                          &local_64,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
    } while (bVar3);
    if (0 < iVar11) {
      uVar6 = uStack_3c - 0x1d;
      if (uStack_3c < 0x1d) {
        uVar6 = uStack_3c;
      }
      uVar8 = local_58.indirect_contents.indirect;
      if (uStack_3c < 0x1d) {
        uVar8 = &local_58;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
                 (uchar *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar8)->
                                  indirect + (long)(int)uVar6),first,last);
      if (0x1c < (script->super_CScriptBase)._size) {
        free((script->super_CScriptBase)._union.indirect_contents.indirect);
      }
      *(ulong *)((long)&(script->super_CScriptBase)._union + 0xc) =
           CONCAT44(local_58._16_4_,local_58._12_4_);
      *(ulong *)((long)&(script->super_CScriptBase)._union + 0x14) =
           CONCAT44(local_58._24_4_,local_58._20_4_);
      (script->super_CScriptBase)._union.indirect_contents.indirect =
           local_58.indirect_contents.indirect;
      *(ulong *)((long)&(script->super_CScriptBase)._union + 8) =
           CONCAT44(local_58._12_4_,local_58.indirect_contents.capacity);
      (script->super_CScriptBase)._size = uStack_3c;
      uStack_3c = 0;
    }
    if (0x1c < uStack_3c) {
      free(local_58.indirect_contents.indirect);
      local_58.indirect_contents.indirect = (char *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar11;
  }
  __stack_chk_fail();
}

Assistant:

int FindAndDelete(CScript& script, const CScript& b)
{
    int nFound = 0;
    if (b.empty())
        return nFound;
    CScript result;
    CScript::const_iterator pc = script.begin(), pc2 = script.begin(), end = script.end();
    opcodetype opcode;
    do
    {
        result.insert(result.end(), pc2, pc);
        while (static_cast<size_t>(end - pc) >= b.size() && std::equal(b.begin(), b.end(), pc))
        {
            pc = pc + b.size();
            ++nFound;
        }
        pc2 = pc;
    }
    while (script.GetOp(pc, opcode));

    if (nFound > 0) {
        result.insert(result.end(), pc2, end);
        script = std::move(result);
    }

    return nFound;
}